

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int xar_close(archive_write *a)

{
  xar_conflict *xar_00;
  uint64_t length_00;
  int iVar1;
  int r;
  uint64_t length;
  uchar *wb;
  xar_conflict *xar;
  archive_write *a_local;
  
  xar_00 = (xar_conflict *)a->format_data;
  if ((xar_00->root->children).first == (file_conflict *)0x0) {
    a_local._4_4_ = 0;
  }
  else {
    length_00 = xar_00->temp_offset;
    file_connect_hardlink_files(xar_00);
    a_local._4_4_ = make_toc(a);
    if (a_local._4_4_ == 0) {
      xar_00->wbuff_remaining = 0x10000;
      archive_be32enc(xar_00->wbuff,0x78617221);
      archive_be16enc(xar_00->wbuff + 4,0x1c);
      archive_be16enc(xar_00->wbuff + 6,1);
      archive_be64enc(xar_00->wbuff + 8,(xar_00->toc).length);
      archive_be64enc(xar_00->wbuff + 0x10,(xar_00->toc).size);
      archive_be32enc(xar_00->wbuff + 0x18,(xar_00->toc).a_sum.alg);
      xar_00->wbuff_remaining = xar_00->wbuff_remaining - 0x1c;
      a_local._4_4_ = copy_out(a,(xar_00->toc).temp_offset,(xar_00->toc).length);
      if (a_local._4_4_ == 0) {
        if ((xar_00->toc).a_sum.len != 0) {
          if ((xar_00->wbuff_remaining < (xar_00->toc).a_sum.len) &&
             (iVar1 = flush_wbuff(a), iVar1 != 0)) {
            return iVar1;
          }
          memcpy((void *)((long)xar_00 + (0x10120 - xar_00->wbuff_remaining)),
                 (xar_00->toc).a_sum.val,(xar_00->toc).a_sum.len);
          xar_00->wbuff_remaining = xar_00->wbuff_remaining - (xar_00->toc).a_sum.len;
        }
        a_local._4_4_ = copy_out(a,(xar_00->toc).a_sum.len,length_00);
        if (a_local._4_4_ == 0) {
          a_local._4_4_ = flush_wbuff(a);
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
xar_close(struct archive_write *a)
{
	struct xar *xar;
	unsigned char *wb;
	uint64_t length;
	int r;

	xar = (struct xar *)a->format_data;

	/* Empty! */
	if (xar->root->children.first == NULL)
		return (ARCHIVE_OK);

	/* Save the length of all file extended attributes and contents. */
	length = xar->temp_offset;

	/* Connect hardlinked files */
	file_connect_hardlink_files(xar);

	/* Make the TOC */
	r = make_toc(a);
	if (r != ARCHIVE_OK)
		return (r);
	/*
	 * Make the xar header on wbuff(write buffer).
	 */
	wb = xar->wbuff;
	xar->wbuff_remaining = sizeof(xar->wbuff);
	archive_be32enc(&wb[0], HEADER_MAGIC);
	archive_be16enc(&wb[4], HEADER_SIZE);
	archive_be16enc(&wb[6], HEADER_VERSION);
	archive_be64enc(&wb[8], xar->toc.length);
	archive_be64enc(&wb[16], xar->toc.size);
	archive_be32enc(&wb[24], xar->toc.a_sum.alg);
	xar->wbuff_remaining -= HEADER_SIZE;

	/*
	 * Write the TOC
	 */
	r = copy_out(a, xar->toc.temp_offset, xar->toc.length);
	if (r != ARCHIVE_OK)
		return (r);

	/* Write the checksum value of the TOC. */
	if (xar->toc.a_sum.len) {
		if (xar->wbuff_remaining < xar->toc.a_sum.len) {
			r = flush_wbuff(a);
			if (r != ARCHIVE_OK)
				return (r);
		}
		wb = xar->wbuff + (sizeof(xar->wbuff) - xar->wbuff_remaining);
		memcpy(wb, xar->toc.a_sum.val, xar->toc.a_sum.len);
		xar->wbuff_remaining -= xar->toc.a_sum.len;
	}

	/*
	 * Write all file extended attributes and contents.
	 */
	r = copy_out(a, xar->toc.a_sum.len, length);
	if (r != ARCHIVE_OK)
		return (r);
	r = flush_wbuff(a);
	return (r);
}